

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[18],char*>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [18],char **params_2)

{
  char *__s;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = *(undefined8 *)this;
  uStack_30 = *(undefined8 *)(this + 8);
  local_48.size_ = strlen((char *)params);
  __s = *(char **)*params_1;
  local_48.ptr = (char *)params;
  local_58.size_ = strlen(__s);
  local_58.ptr = __s;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}